

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_event.c
# Opt level: O2

void te_init(tsd_t *tsd,_Bool is_alloc)

{
  ulong uVar1;
  uint64_t uVar2;
  ulong uVar3;
  undefined7 in_register_00000031;
  long lStack_50;
  te_ctx_t local_48;
  
  uVar1 = (ulong)!is_alloc;
  local_48.current =
       (uint64_t *)
       ((long)(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins +
       uVar1 * 0x10 + -0x28);
  local_48.last_event =
       &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_last_event +
       uVar1 * 2;
  local_48.next_event =
       &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event +
       uVar1 * 2;
  local_48.next_event_fast =
       (uint64_t *)
       ((long)(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins +
       uVar1 * 0x10 + -0x20);
  local_48.next_event[-1] = local_48.next_event_fast[-1];
  uVar1 = 0xffffffffffffffff;
  local_48.is_alloc = is_alloc;
  if (((int)CONCAT71(in_register_00000031,is_alloc) != 0) &&
     (duckdb_je_opt_tcache_gc_incr_bytes != 0)) {
    uVar1 = duckdb_je_tcache_gc_new_event_wait(tsd);
    tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_gc_event_wait = uVar1;
  }
  if ((is_alloc) && (-1 < duckdb_je_opt_stats_interval)) {
    uVar2 = duckdb_je_stats_interval_new_event_wait(tsd);
    tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_stats_interval_event_wait = uVar2;
    if (uVar2 < uVar1) {
      uVar1 = uVar2;
    }
  }
  if ((!is_alloc) && (duckdb_je_opt_tcache_gc_incr_bytes != 0)) {
    uVar2 = duckdb_je_tcache_gc_dalloc_new_event_wait(tsd);
    tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_gc_dalloc_event_wait = uVar2;
    if (uVar2 < uVar1) {
      uVar1 = uVar2;
    }
  }
  if (is_alloc) {
    uVar3 = duckdb_je_peak_alloc_new_event_wait(tsd);
    lStack_50 = 0x58;
  }
  else {
    uVar3 = duckdb_je_peak_dalloc_new_event_wait(tsd);
    lStack_50 = 0x60;
  }
  *(ulong *)(&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled + lStack_50)
       = uVar3;
  if (uVar3 < uVar1) {
    uVar1 = uVar3;
  }
  te_adjust_thresholds_helper(tsd,&local_48,uVar1);
  return;
}

Assistant:

static void
te_init(tsd_t *tsd, bool is_alloc) {
	te_ctx_t ctx;
	te_ctx_get(tsd, &ctx, is_alloc);
	/*
	 * Reset the last event to current, which starts the events from a clean
	 * state.  This is necessary when re-init the tsd event counters.
	 *
	 * The event counters maintain a relationship with the current bytes:
	 * last_event <= current < next_event.  When a reinit happens (e.g.
	 * reincarnated tsd), the last event needs progressing because all
	 * events start fresh from the current bytes.
	 */
	te_ctx_last_event_set(&ctx, te_ctx_current_bytes_get(&ctx));

	uint64_t wait = TE_MAX_START_WAIT;
#define E(event, condition, alloc_event)				\
	if (is_alloc == alloc_event && condition) {			\
		uint64_t event_wait = event##_new_event_wait(tsd);	\
		event_wait = te_clip_event_wait(event_wait);		\
		event##_event_wait_set(tsd, event_wait);		\
		if (event_wait < wait) {				\
			wait = event_wait;				\
		}							\
	}

	ITERATE_OVER_ALL_EVENTS
#undef E
	te_adjust_thresholds_helper(tsd, &ctx, wait);
}